

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::split_token
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  iterator *piVar1;
  _Elt_pointer pptVar2;
  int iVar3;
  compile_error *this_00;
  _Map_pointer ppptVar4;
  _Elt_pointer pptVar5;
  bool bVar6;
  _Elt_pointer pptVar7;
  string local_58;
  _Elt_pointer local_38;
  
  pptVar7 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_38 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (pptVar7 != local_38) {
    pptVar5 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppptVar4 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
               .super__Deque_impl_data._M_start._M_node;
    bVar6 = false;
    do {
      iVar3 = (*(*pptVar7)->_vptr_token_base[2])();
      if (iVar3 == 2) {
        this_00 = (compile_error *)__cxa_allocate_exception(0x28);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Wrong format of expression.","");
        compile_error::compile_error(this_00,&local_58);
        __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
      }
      iVar3 = (*(*pptVar7)->_vptr_token_base[2])();
      if (iVar3 == 3) {
        if (!bVar6) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          pptVar2 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pptVar2 ==
              (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
            _M_push_back_aux<cs::token_base*>
                      ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)objects,
                       (token_base **)&local_58);
          }
          else {
            *pptVar2 = (token_base *)0x0;
            piVar1 = &(objects->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        pptVar2 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar2 ==
            (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*const&>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)signals,pptVar7);
        }
        else {
          *pptVar2 = *pptVar7;
          piVar1 = &(signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        bVar6 = false;
      }
      else {
        pptVar2 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar2 ==
            (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*const&>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)objects,pptVar7);
        }
        else {
          *pptVar2 = *pptVar7;
          piVar1 = &(objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                    )._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        bVar6 = true;
      }
      pptVar7 = pptVar7 + 1;
      if (pptVar7 == pptVar5) {
        pptVar7 = ppptVar4[1];
        ppptVar4 = ppptVar4 + 1;
        pptVar5 = pptVar7 + 0x40;
      }
    } while (pptVar7 != local_38);
    if (bVar6) {
      return;
    }
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  pptVar7 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar7 ==
      (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
              ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)objects,
               (token_base **)&local_58);
  }
  else {
    *pptVar7 = (token_base *)0x0;
    piVar1 = &(objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void compiler_type::split_token(std::deque<token_base *> &raw, std::deque<token_base *> &signals,
	                                std::deque<token_base *> &objects)
	{
		bool request_signal = false;
		for (auto &ptr: raw) {
			if (ptr->get_type() == token_types::action)
				throw compile_error("Wrong format of expression.");
			if (ptr->get_type() == token_types::signal) {
				if (!request_signal)
					objects.push_back(nullptr);
				signals.push_back(ptr);
				request_signal = false;
			}
			else {
				objects.push_back(ptr);
				request_signal = true;
			}
		}
		if (!request_signal)
			objects.push_back(nullptr);
	}